

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unqlite.c
# Opt level: O0

sxi64 HashmapCount(jx9_hashmap *pMap,int bRecursive,int iRecCount)

{
  undefined8 *puVar1;
  sxi64 sVar2;
  uint local_3c;
  sxu32 n;
  jx9_value *pElem;
  jx9_hashmap_node *pEntry;
  sxi64 iCount;
  int iRecCount_local;
  int bRecursive_local;
  jx9_hashmap *pMap_local;
  
  pEntry = (jx9_hashmap_node *)0x0;
  if (bRecursive == 0) {
    pEntry = (jx9_hashmap_node *)(ulong)pMap->nEntry;
  }
  else {
    pElem = (jx9_value *)pMap->pLast;
    for (local_3c = 0; local_3c < pMap->nEntry; local_3c = local_3c + 1) {
      puVar1 = (undefined8 *)SySetAt(&pMap->pVm->aMemObj,pElem->nIdx);
      if ((puVar1 != (undefined8 *)0x0) && ((*(uint *)(puVar1 + 1) & 0x40) != 0)) {
        if (0x1f < iRecCount) {
          return (sxi64)pEntry;
        }
        sVar2 = HashmapCount((jx9_hashmap *)*puVar1,1,iRecCount + 1);
        pEntry = (jx9_hashmap_node *)((long)&pEntry->pMap + sVar2);
      }
      pElem = (jx9_value *)pElem[1].x.pOther;
    }
    pEntry = (jx9_hashmap_node *)((long)&pEntry->pMap + (ulong)pMap->nEntry);
  }
  return (sxi64)pEntry;
}

Assistant:

static sxi64 HashmapCount(jx9_hashmap *pMap, int bRecursive, int iRecCount)
{
	sxi64 iCount = 0;
	if( !bRecursive ){
		iCount = pMap->nEntry;
	}else{
		/* Recursive hashmap walk */
		jx9_hashmap_node *pEntry = pMap->pLast;
		jx9_value *pElem;
		sxu32 n = 0;
		for(;;){
			if( n >= pMap->nEntry ){
				break;
			}
			/* Point to the element value */
			pElem = (jx9_value *)SySetAt(&pMap->pVm->aMemObj, pEntry->nValIdx);
			if( pElem ){
				if( pElem->iFlags & MEMOBJ_HASHMAP ){
					if( iRecCount > 31 ){
						/* Nesting limit reached */
						return iCount;
					}
					/* Recurse */
					iRecCount++;
					iCount += HashmapCount((jx9_hashmap *)pElem->x.pOther, TRUE, iRecCount);
					iRecCount--;
				}
			}
			/* Point to the next entry */
			pEntry = pEntry->pNext;
			++n;
		}
		/* Update count */
		iCount += pMap->nEntry;
	}
	return iCount;
}